

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

void process_state_changes(AMQP_MESSENGER_INSTANCE_conflict *instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG p_Stack_38;
  _Bool is_timed_out_1;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG p_Stack_18;
  _Bool is_timed_out;
  LOGGER_LOG l;
  AMQP_MESSENGER_INSTANCE_conflict *instance_local;
  
  l = (LOGGER_LOG)instance;
  if (instance->state == AMQP_MESSENGER_STATE_STARTED) {
    if (instance->message_sender_current_state == MESSAGE_SENDER_STATE_OPEN) {
      if ((instance->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) &&
         (instance->message_receiver_current_state != MESSAGE_RECEIVER_STATE_OPEN)) {
        if (instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_OPENING) {
          iVar1 = is_timeout_reached(instance->last_message_receiver_state_change_time,300,
                                     (_Bool *)((long)&l_1 + 7));
          if (iVar1 == 0) {
            if ((l_1._7_1_ & 1) != 0) {
              l_3 = xlogging_get_log_function();
              if (l_3 != (LOGGER_LOG)0x0) {
                (*l_3)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                       ,"process_state_changes",0x50e,1,
                       "messenger got an error (messagereceiver failed to start within expected timeout (%d secs))"
                       ,300);
              }
              update_messenger_state
                        ((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
            }
          }
          else {
            l_2 = xlogging_get_log_function();
            if (l_2 != (LOGGER_LOG)0x0) {
              (*l_2)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                     ,"process_state_changes",0x509,1,
                     "messenger got an error (failed to verify messagereceiver start timeout)");
            }
            update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR)
            ;
          }
        }
        else if ((instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_ERROR) ||
                (instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_IDLE)) {
          p_Stack_38 = xlogging_get_log_function();
          if (p_Stack_38 != (LOGGER_LOG)0x0) {
            (*p_Stack_38)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"process_state_changes",0x515,1,
                          "messagereceiver reported unexpected state %d while messenger is starting"
                          ,*(undefined4 *)(l + 0x60));
          }
          update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
        }
      }
    }
    else {
      p_Stack_18 = xlogging_get_log_function();
      if (p_Stack_18 != (LOGGER_LOG)0x0) {
        (*p_Stack_18)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"process_state_changes",0x4ff,1,
                      "messagesender reported unexpected state %d while messenger was started",
                      *(undefined4 *)(l + 0x48));
      }
      update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
    }
  }
  else if (instance->state == AMQP_MESSENGER_STATE_STARTING) {
    if (instance->message_sender_current_state == MESSAGE_SENDER_STATE_OPEN) {
      update_messenger_state(instance,AMQP_MESSENGER_STATE_STARTED);
    }
    else if (instance->message_sender_current_state == MESSAGE_SENDER_STATE_OPENING) {
      iVar1 = is_timeout_reached(instance->last_message_sender_state_change_time,300,
                                 (_Bool *)((long)&l_4 + 7));
      if (iVar1 == 0) {
        if ((l_4._7_1_ & 1) != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                      ,"process_state_changes",0x52c,1,
                      "messenger failed to start (messagesender failed to start within expected timeout (%d secs))"
                      ,300);
          }
          update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"process_state_changes",0x527,1,
                    "messenger failed to start (failed to verify messagesender start timeout)");
        }
        update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
      }
    }
    else if (((instance->message_sender_current_state == MESSAGE_SENDER_STATE_ERROR) ||
             (instance->message_sender_current_state == MESSAGE_SENDER_STATE_CLOSING)) ||
            ((instance->message_sender_current_state == MESSAGE_SENDER_STATE_IDLE &&
             (instance->message_sender != (MESSAGE_SENDER_HANDLE)0x0)))) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"process_state_changes",0x536,1,
                  "messagesender reported unexpected state %d while messenger is starting",
                  *(undefined4 *)(l + 0x48));
      }
      update_messenger_state((AMQP_MESSENGER_INSTANCE_conflict *)l,AMQP_MESSENGER_STATE_ERROR);
    }
  }
  return;
}

Assistant:

static void process_state_changes(TELEMETRY_MESSENGER_INSTANCE* instance)
{
    // Note: messagesender and messagereceiver are still not created or already destroyed
    //       when state is TELEMETRY_MESSENGER_STATE_STOPPED, so no checking is needed there.

    if (instance->state == TELEMETRY_MESSENGER_STATE_STARTED)
    {
        if (instance->message_sender_current_state != MESSAGE_SENDER_STATE_OPEN)
        {
            LogError("messagesender reported unexpected state %d while messenger was started", instance->message_sender_current_state);
            update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
        }
        else if (instance->message_receiver != NULL && instance->message_receiver_current_state != MESSAGE_RECEIVER_STATE_OPEN)
        {
            if (instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_OPENING)
            {
                int is_timed_out;
                if (is_timeout_reached(instance->last_message_receiver_state_change_time, MAX_MESSAGE_RECEIVER_STATE_CHANGE_TIMEOUT_SECS, &is_timed_out) != RESULT_OK)
                {
                    LogError("messenger got an error (failed to verify messagereceiver start timeout)");
                    update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
                }
                else if (is_timed_out == 1)
                {
                    LogError("messenger got an error (messagereceiver failed to start within expected timeout (%d secs))", MAX_MESSAGE_RECEIVER_STATE_CHANGE_TIMEOUT_SECS);
                    update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
                }
            }
            else if (instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_ERROR ||
                instance->message_receiver_current_state == MESSAGE_RECEIVER_STATE_IDLE)
            {
                LogError("messagereceiver reported unexpected state %d while messenger is starting", instance->message_receiver_current_state);
                update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
            }
        }
    }
    else
    {
        if (instance->state == TELEMETRY_MESSENGER_STATE_STARTING)
        {
            if (instance->message_sender_current_state == MESSAGE_SENDER_STATE_OPEN)
            {
                update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_STARTED);
            }
            else if (instance->message_sender_current_state == MESSAGE_SENDER_STATE_OPENING)
            {
                int is_timed_out;
                if (is_timeout_reached(instance->last_message_sender_state_change_time, MAX_MESSAGE_SENDER_STATE_CHANGE_TIMEOUT_SECS, &is_timed_out) != RESULT_OK)
                {
                    LogError("messenger failed to start (failed to verify messagesender start timeout)");
                    update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
                }
                else if (is_timed_out == 1)
                {
                    LogError("messenger failed to start (messagesender failed to start within expected timeout (%d secs))", MAX_MESSAGE_SENDER_STATE_CHANGE_TIMEOUT_SECS);
                    update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
                }
            }
            // For this module, the only valid scenario where messagesender state is IDLE is if
            // the messagesender hasn't been created yet or already destroyed.
            else if ((instance->message_sender_current_state == MESSAGE_SENDER_STATE_ERROR) ||
                (instance->message_sender_current_state == MESSAGE_SENDER_STATE_CLOSING) ||
                (instance->message_sender_current_state == MESSAGE_SENDER_STATE_IDLE && instance->message_sender != NULL))
            {
                LogError("messagesender reported unexpected state %d while messenger is starting", instance->message_sender_current_state);
                update_messenger_state(instance, TELEMETRY_MESSENGER_STATE_ERROR);
            }
        }
        // message sender and receiver are stopped/destroyed synchronously, so no need for state control.
    }
}